

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O2

void AddSymTab(char *label,long value,long hunk,int line,int flags)

{
  SymTab *pSVar1;
  size_t sVar2;
  char *pcVar3;
  SymTab *pSVar4;
  SymTab *pSVar5;
  char wnum [6];
  char wlab [128];
  char local_be [6];
  char local_b8 [136];
  
  strcpy(local_b8,label);
  if (9 < (byte)(*label - 0x30U)) {
    if (*label != '\\') goto LAB_0010b5a1;
    sVar2 = strlen(local_b8);
    (local_b8 + sVar2)[0] = '$';
    (local_b8 + sVar2)[1] = '\0';
  }
  sprintf(local_be,"%d",(ulong)(uint)LabLine);
  strcat(local_b8,local_be);
LAB_0010b5a1:
  pSVar5 = SymCurr;
  Sym = SymLim;
  pSVar1 = SymLim + 1;
  pSVar4 = SymLim;
  SymLim = pSVar1;
  if (0x2000 < (long)pSVar1 - (long)SymCurr) {
    Sym = (SymTab *)malloc(0x2000);
    if (Sym == (SymTab *)0x0) {
      quit_cleanup("Out of memory!\n");
      pSVar5 = SymCurr;
    }
    pSVar5->Link = Sym;
    SymCurr = Sym;
    Sym->Link = (SymTab *)0x0;
    pSVar4 = Sym + 1;
    SymLim = Sym + 2;
  }
  Sym = pSVar4;
  pSVar4->Link = (SymTab *)0x0;
  pcVar3 = AddName(local_b8,0);
  pSVar1 = Sym;
  Sym->Nam = pcVar3;
  pSVar1->Val = value;
  pSVar1->Hunk = hunk;
  pSVar1->Defn = line;
  pSVar1->Flags = flags;
  pSVar1->Ref1 = (Ref *)0x0;
  NumSyms = NumSyms + 1;
  pSVar4 = (SymTab *)HashIt(local_b8);
  for (pSVar5 = pSVar4->Link; pSVar5 != (SymTab *)0x0; pSVar5 = pSVar5->Link) {
    pSVar4 = pSVar5;
  }
  pSVar4->Link = pSVar1;
  return;
}

Assistant:

void AddSymTab(label, value, hunk, line, flags)
	char label[];long value, hunk;int line, flags;
/* Inserts a new entry to the symbol table and increments NumSyms.
 "Sym" will be set to point to the new entry.
 If the label is a local label (i.e. the first character is
 a numeric digit or a backslash), the current contents of LabLine
 will be converted to characters and appended to the label before
 it is added.  If the first character of the label is a backslash
 (i.e. a named local variable) a dollar sign will be appended
 to the label ahead of the value of LabLine.                        */
{
	char wlab[MAXLINE], wnum[6];
	register struct SymTab *chainsym, **hashindex;

	strcpy(wlab, label);
	if (((label[0] >= '0') && (label[0] <= '9')) || (label[0] == '\\')) {
		if (label[0] == '\\')
			strcat(wlab, "$");
		sprintf(wnum, "%d", LabLine); /* If it's a local label, */
		strcat(wlab, wnum); /*    append LabLine.     */
	}

	Sym = SymLim; /* Pointer to new entry */
	SymLim++; /* Bump limit pointer. */
	if (((char *) SymLim - (char *) SymCurr) > CHUNKSIZE) {
		Sym = (struct SymTab *) malloc((unsigned) CHUNKSIZE);
		if (Sym == NULL)
			quit_cleanup("Out of memory!\n");
		SymCurr->Link = Sym; /* Link from previous chunk */
		SymCurr = Sym; /* Make the new chunk current. */
		SymCurr->Link = NULL; /* Clear forward pointer. */
		Sym++; /* Skip over pointer entry. */
		SymLim = Sym; /* New table limit */
		SymLim++; /* Bump it. */
	}
	Sym->Link = NULL; /* Clear hash chain link. */
	Sym->Nam = AddName(wlab, 0); /* Pointer to symbol */
	Sym->Val = value; /* Value */
	Sym->Hunk = hunk; /* Hunk number */
	Sym->Defn = line; /* Statement number */
	Sym->Flags = flags; /* Flags */
	Sym->Ref1 = NULL; /* Reference pointer */
	NumSyms++; /* Count symbols. */

	hashindex = HashIt(wlab); /* Get hash index. */
	if (*hashindex == NULL) {
		*hashindex = Sym; /* First entry in this hash chain */
		return;
	}
	chainsym = *hashindex;
	while (chainsym->Link != NULL)
		chainsym = chainsym->Link; /* Scan for end of hash chain. */
	chainsym->Link = Sym; /* Insert new entry at the end. */
}